

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O1

cubeb_resampler *
cubeb_resampler_create_internal<float>
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  uint32_t uVar1;
  delay_line<float> *pdVar2;
  void *pvVar3;
  cubeb_log_level cVar4;
  int iVar5;
  uint32_t uVar6;
  cubeb_log_callback p_Var7;
  passthrough_resampler<float> *this;
  cubeb_resampler_speex_one_way<float> *this_00;
  cubeb_resampler_speex_one_way<float> *this_01;
  delay_line<float> *pdVar8;
  code *pcVar9;
  uint32_t uVar10;
  bool bVar11;
  delay_line<float> *local_60;
  delay_line<float> *local_58;
  void *local_50;
  cubeb_resampler_speex_one_way<float> *local_48;
  cubeb_stream *local_40;
  cubeb_data_callback local_38;
  
  local_58 = (delay_line<float> *)0x0;
  local_60 = (delay_line<float> *)0x0;
  if (((((input_params == (cubeb_stream_params *)0x0) ||
        (output_params == (cubeb_stream_params *)0x0)) || (input_params->rate != target_rate)) ||
      (output_params->rate != target_rate)) &&
     (((output_params != (cubeb_stream_params *)0x0 || input_params == (cubeb_stream_params *)0x0 ||
       (input_params->rate != target_rate)) &&
      ((output_params == (cubeb_stream_params *)0x0 || input_params != (cubeb_stream_params *)0x0 ||
       (output_params->rate != target_rate)))))) {
    local_50 = user_ptr;
    local_38 = callback;
    if (output_params == (cubeb_stream_params *)0x0) {
      this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
    }
    else {
      uVar10 = output_params->rate;
      if (uVar10 == target_rate) {
        this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else {
        this_00 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
        iVar5 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar5 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                  (this_00,output_params->channels,target_rate,uVar10,iVar5);
      }
    }
    local_40 = stream;
    if (input_params == (cubeb_stream_params *)0x0) {
      this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
    }
    else {
      uVar10 = input_params->rate;
      if (uVar10 == target_rate) {
        this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
      }
      else {
        this_01 = (cubeb_resampler_speex_one_way<float> *)operator_new(0x58);
        iVar5 = -1;
        if (quality < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
          iVar5 = quality + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
        }
        cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
                  (this_01,input_params->channels,uVar10,target_rate,iVar5);
      }
    }
    pvVar3 = local_50;
    if ((((this_01 == (cubeb_resampler_speex_one_way<float> *)0x0) ||
         (output_params == (cubeb_stream_params *)0x0)) ||
        (input_params == (cubeb_stream_params *)0x0)) ||
       (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0)) {
      if (((this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) &&
          (output_params != (cubeb_stream_params *)0x0)) &&
         ((input_params != (cubeb_stream_params *)0x0 &&
          (this_01 == (cubeb_resampler_speex_one_way<float> *)0x0)))) {
        pdVar8 = (delay_line<float> *)operator_new(0x48);
        iVar5 = speex_resampler_get_output_latency(this_00->speex_resampler);
        uVar6 = iVar5 + this_00->additional_latency;
        uVar10 = input_params->channels;
        uVar1 = output_params->rate;
        (pdVar8->super_processor).channels = uVar10;
        pdVar8->length = uVar6;
        pdVar8->leftover_samples = 0;
        (pdVar8->delay_output_buffer).capacity_ = 0;
        (pdVar8->delay_output_buffer).length_ = 0;
        (pdVar8->delay_input_buffer).length_ = 0;
        (pdVar8->delay_output_buffer).data_ = (float *)0x0;
        (pdVar8->delay_input_buffer).data_ = (float *)0x0;
        (pdVar8->delay_input_buffer).capacity_ = 0;
        pdVar8->sample_rate = uVar1;
        auto_array<float>::push_silence(&pdVar8->delay_input_buffer,(ulong)(uVar10 * uVar6));
        pdVar2 = local_58;
        bVar11 = local_58 != (delay_line<float> *)0x0;
        local_58 = pdVar8;
        if (bVar11) {
          std::default_delete<delay_line<float>_>::operator()
                    ((default_delete<delay_line<float>_> *)&local_58,pdVar2);
          pdVar8 = local_58;
        }
        goto joined_r0x001144d5;
      }
    }
    else {
      pdVar8 = (delay_line<float> *)operator_new(0x48);
      iVar5 = speex_resampler_get_output_latency(this_01->speex_resampler);
      uVar6 = iVar5 + this_01->additional_latency;
      uVar10 = output_params->rate;
      uVar1 = output_params->channels;
      (pdVar8->super_processor).channels = uVar1;
      pdVar8->length = uVar6;
      pdVar8->leftover_samples = 0;
      (pdVar8->delay_output_buffer).capacity_ = 0;
      (pdVar8->delay_output_buffer).length_ = 0;
      (pdVar8->delay_input_buffer).length_ = 0;
      (pdVar8->delay_output_buffer).data_ = (float *)0x0;
      (pdVar8->delay_input_buffer).data_ = (float *)0x0;
      (pdVar8->delay_input_buffer).capacity_ = 0;
      pdVar8->sample_rate = uVar10;
      auto_array<float>::push_silence(&pdVar8->delay_input_buffer,(ulong)(uVar1 * uVar6));
      pdVar2 = local_60;
      bVar11 = local_60 != (delay_line<float> *)0x0;
      local_60 = pdVar8;
      if (bVar11) {
        std::default_delete<delay_line<float>_>::operator()
                  ((default_delete<delay_line<float>_> *)&local_60,pdVar2);
        pdVar8 = local_60;
      }
joined_r0x001144d5:
      if (pdVar8 == (delay_line<float> *)0x0) {
        this = (passthrough_resampler<float> *)0x0;
        goto LAB_0011458e;
      }
    }
    bVar11 = this_00 != (cubeb_resampler_speex_one_way<float> *)0x0;
    local_48 = this_00;
    cVar4 = cubeb_log_get_level();
    this_00 = local_48;
    if (bVar11 && this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
      if ((0 < (int)cVar4) && (p_Var7 = cubeb_log_get_callback(), p_Var7 != (cubeb_log_callback)0x0)
         ) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x259,
                           "Resampling input (%d) and output (%d) to target rate of %dHz",
                           (ulong)input_params->rate,(ulong)output_params->rate,(ulong)target_rate);
      }
      this = (passthrough_resampler<float> *)operator_new(0x48);
      (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b8c8;
      *(cubeb_resampler_speex_one_way<float> **)&this->super_processor = this_01;
      this->stream = (cubeb_stream *)local_48;
      (this->internal_input_buffer).data_ = (float *)local_40;
      (this->internal_input_buffer).capacity_ = (size_t)local_38;
      (this->internal_input_buffer).length_ = (size_t)pvVar3;
      *(undefined1 *)&this->sample_rate = 0;
      this->data_callback =
           cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
           ::fill_internal_duplex;
      this->user_ptr = (void *)0x0;
      goto LAB_00114588;
    }
    if (this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
      if ((0 < (int)cVar4) && (p_Var7 = cubeb_log_get_callback(), p_Var7 != (cubeb_log_callback)0x0)
         ) {
        cubeb_log_internal("cubeb_resampler_internal.h",0x260,
                           "Resampling input (%d) to target and output rate of %dHz",
                           (ulong)input_params->rate,(ulong)target_rate);
      }
      this = (passthrough_resampler<float> *)operator_new(0x48);
      pdVar8 = local_60;
      local_60 = (delay_line<float> *)0x0;
      (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b900;
      *(cubeb_resampler_speex_one_way<float> **)&this->super_processor = this_01;
      this->stream = (cubeb_stream *)pdVar8;
      (this->internal_input_buffer).data_ = (float *)local_40;
      (this->internal_input_buffer).capacity_ = (size_t)local_38;
      (this->internal_input_buffer).length_ = (size_t)pvVar3;
      *(undefined1 *)&this->sample_rate = 0;
      if (pdVar8 == (delay_line<float> *)0x0) {
        pcVar9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                 ::fill_internal_input;
      }
      else {
        pcVar9 = cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
                 ::fill_internal_duplex;
      }
      this->data_callback = pcVar9;
      this->user_ptr = (void *)0x0;
      this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
      goto LAB_0011458e;
    }
    if ((0 < (int)cVar4) && (p_Var7 = cubeb_log_get_callback(), p_Var7 != (cubeb_log_callback)0x0))
    {
      cubeb_log_internal("cubeb_resampler_internal.h",0x267,
                         "Resampling output (%dHz) to target and input rate of %dHz",
                         (ulong)output_params->rate,(ulong)target_rate);
    }
    this = (passthrough_resampler<float> *)operator_new(0x48);
    pdVar8 = local_58;
    local_58 = (delay_line<float> *)0x0;
    (this->super_cubeb_resampler)._vptr_cubeb_resampler = (_func_int **)&PTR_fill_0016b938;
    *(delay_line<float> **)&this->super_processor = pdVar8;
    this->stream = (cubeb_stream *)this_00;
    (this->internal_input_buffer).data_ = (float *)local_40;
    (this->internal_input_buffer).capacity_ = (size_t)local_38;
    (this->internal_input_buffer).length_ = (size_t)pvVar3;
    *(undefined1 *)&this->sample_rate = 0;
    if (this_00 == (cubeb_resampler_speex_one_way<float> *)0x0 || pdVar8 == (delay_line<float> *)0x0
       ) {
      if (pdVar8 != (delay_line<float> *)0x0) {
        pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                 ::fill_internal_input;
        goto LAB_0011475b;
      }
      if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) {
        pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
                 ::fill_internal_output;
        goto LAB_0011475b;
      }
    }
    else {
      pcVar9 = cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
               ::fill_internal_duplex;
LAB_0011475b:
      this->data_callback = pcVar9;
      this->user_ptr = (void *)0x0;
    }
  }
  else {
    cVar4 = cubeb_log_get_level();
    if ((0 < (int)cVar4) && (p_Var7 = cubeb_log_get_callback(), p_Var7 != (cubeb_log_callback)0x0))
    {
      cubeb_log_internal("cubeb_resampler_internal.h",0x229,
                         "Input and output sample-rate match, target rate of %dHz",
                         (ulong)target_rate);
    }
    this = (passthrough_resampler<float> *)operator_new(0x48);
    if (input_params == (cubeb_stream_params *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = input_params->channels;
    }
    passthrough_resampler<float>::passthrough_resampler
              (this,stream,callback,user_ptr,uVar10,target_rate);
LAB_00114588:
    this_01 = (cubeb_resampler_speex_one_way<float> *)0x0;
  }
  this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
LAB_0011458e:
  if (local_60 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&local_60,local_60);
  }
  if (local_58 != (delay_line<float> *)0x0) {
    std::default_delete<delay_line<float>_>::operator()
              ((default_delete<delay_line<float>_> *)&local_58,local_58);
  }
  if (this_00 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*(code *)((cubeb *)this_00->_vptr_cubeb_resampler_speex_one_way)[1].ops)(this_00);
  }
  if (this_01 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    (*this_01->_vptr_cubeb_resampler_speex_one_way[1])(this_01);
  }
  return &this->super_cubeb_resampler;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create_internal(cubeb_stream * stream,
                                cubeb_stream_params * input_params,
                                cubeb_stream_params * output_params,
                                unsigned int target_rate,
                                cubeb_data_callback callback, void * user_ptr,
                                cubeb_resampler_quality quality,
                                cubeb_resampler_reclock reclock)
{
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> input_resampler = nullptr;
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> output_resampler = nullptr;
  std::unique_ptr<delay_line<T>> input_delay = nullptr;
  std::unique_ptr<delay_line<T>> output_delay = nullptr;

  assert((input_params || output_params) &&
         "need at least one valid parameter pointer.");

  /* All the streams we have have a sample rate that matches the target
     sample rate, use a no-op resampler, that simply forwards the buffers to
     the callback. */
  if (((input_params && input_params->rate == target_rate) &&
       (output_params && output_params->rate == target_rate)) ||
      (input_params && !output_params && (input_params->rate == target_rate)) ||
      (output_params && !input_params &&
       (output_params->rate == target_rate))) {
    LOG("Input and output sample-rate match, target rate of %dHz", target_rate);
    return new passthrough_resampler<T>(
        stream, callback, user_ptr, input_params ? input_params->channels : 0,
        target_rate);
  }

  /* Determine if we need to resampler one or both directions, and create the
     resamplers. */
  if (output_params && (output_params->rate != target_rate)) {
    output_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        output_params->channels, target_rate, output_params->rate,
        to_speex_quality(quality)));
    if (!output_resampler) {
      return NULL;
    }
  }

  if (input_params && (input_params->rate != target_rate)) {
    input_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        input_params->channels, input_params->rate, target_rate,
        to_speex_quality(quality)));
    if (!input_resampler) {
      return NULL;
    }
  }

  /* If we resample only one direction but we have a duplex stream, insert a
   * delay line with a length equal to the resampler latency of the
   * other direction so that the streams are synchronized. */
  if (input_resampler && !output_resampler && input_params && output_params) {
    output_delay.reset(new delay_line<T>(input_resampler->latency(),
                                         output_params->channels,
                                         output_params->rate));
    if (!output_delay) {
      return NULL;
    }
  } else if (output_resampler && !input_resampler && input_params &&
             output_params) {
    input_delay.reset(new delay_line<T>(output_resampler->latency(),
                                        input_params->channels,
                                        output_params->rate));
    if (!input_delay) {
      return NULL;
    }
  }

  if (input_resampler && output_resampler) {
    LOG("Resampling input (%d) and output (%d) to target rate of %dHz",
        input_params->rate, output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_resampler.release(), output_resampler.release(), stream, callback,
        user_ptr);
  } else if (input_resampler) {
    LOG("Resampling input (%d) to target and output rate of %dHz",
        input_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     delay_line<T>>(input_resampler.release(),
                                                    output_delay.release(),
                                                    stream, callback, user_ptr);
  } else {
    LOG("Resampling output (%dHz) to target and input rate of %dHz",
        output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, delay_line<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_delay.release(), output_resampler.release(), stream, callback,
        user_ptr);
  }
}